

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O0

internal_node *
pstore::index::details::internal_node::
make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
          (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *container,
          index_pointer node,internal_node *internal)

{
  bool bVar1;
  index_pointer __one;
  internal_node *inode;
  internal_node *internal_local;
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *container_local;
  index_pointer node_local;
  
  container_local =
       (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *)node;
  bVar1 = index_pointer::is_heap((index_pointer *)&container_local);
  if (bVar1) {
    __one.internal_ =
         index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&container_local);
    bVar1 = std::operator==(&(__one.internal_)->signature_,
                            (array<unsigned_char,_8UL> *)&node_signature_);
    node_local.internal_ = __one.internal_;
    if (!bVar1) {
      assert_failed("inode->signature_ == node_signature_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0x272);
    }
  }
  else {
    node_local.internal_ =
         allocate<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                   (container,internal);
  }
  return node_local.internal_;
}

Assistant:

static internal_node * make_writable (SequenceContainer * const container,
                                                      index_pointer const node,
                                                      internal_node const & internal) {
                    if (node.is_heap ()) {
                        auto * const inode = node.untag<internal_node *> ();
                        PSTORE_ASSERT (inode->signature_ == node_signature_);
                        return inode;
                    }

                    return allocate (container, internal);
                }